

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

Lambda * skiwi::make_lambda(Lambda *__return_storage_ptr__,
                           vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _anonymous_namespace_ *tokens_00;
  bool bVar5;
  e_type eVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  Begin *pBVar10;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_01;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_02;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_03;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX_00;
  bool local_461;
  value_type local_3d0;
  undefined1 local_2e0 [8];
  Begin beg;
  undefined1 local_230 [8];
  Begin b;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  undefined1 local_160 [8];
  token tok_1;
  int local_110;
  allocator<char> local_109;
  int count_after_var;
  undefined1 local_e8 [8];
  token tok;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  string name;
  allocator<char> local_39;
  string local_38;
  _anonymous_namespace_ *local_18;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_local;
  Lambda *l;
  
  local_18 = (_anonymous_namespace_ *)tokens;
  tokens_local = (vector<skiwi::token,_std::allocator<skiwi::token>_> *)__return_storage_ptr__;
  bVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::empty(tokens);
  if (bVar5) {
    anon_unknown_2::throw_parse_error(no_tokens);
  }
  eVar6 = anon_unknown_2::current_type
                    ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  if (eVar6 != T_ID) {
    pvVar7 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    iVar1 = pvVar7->line_nr;
    pvVar7 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    iVar2 = pvVar7->column_nr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    anon_unknown_2::throw_parse_error(iVar1,iVar2,bad_syntax,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  name.field_2._M_local_buf[0xb] = '\0';
  Lambda::Lambda(__return_storage_ptr__);
  pvVar7 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                     ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  __return_storage_ptr__->line_nr = pvVar7->line_nr;
  pvVar7 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                     ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  __return_storage_ptr__->column_nr = pvVar7->column_nr;
  (anonymous_namespace)::current_abi_cxx11_((string *)local_70,local_18,tokens_01);
  __return_storage_ptr__->variable_arity = false;
  bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_70,"lambda");
  if (bVar5) {
    pvVar7 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    iVar1 = pvVar7->line_nr;
    pvVar7 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    iVar2 = pvVar7->column_nr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"lambda",&local_91);
    anon_unknown_2::throw_parse_error(iVar1,iVar2,expected_keyword,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  anon_unknown_2::advance((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  (anonymous_namespace)::current_abi_cxx11_((string *)&tok.line_nr,local_18,tokens_02);
  bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &tok.line_nr,"(");
  std::__cxx11::string::~string((string *)&tok.line_nr);
  tokens_00 = local_18;
  if (bVar5) {
    __return_storage_ptr__->variable_arity = true;
    anon_unknown_2::take
              ((token *)local_e8,(vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->variables,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tok);
    token::~token((token *)local_e8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&count_after_var,"(",&local_109);
    anon_unknown_2::require
              ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)tokens_00,
               (string *)&count_after_var);
    std::__cxx11::string::~string((string *)&count_after_var);
    std::allocator<char>::~allocator(&local_109);
    local_110 = 0;
    tokens_03 = extraout_RDX;
    while( true ) {
      (anonymous_namespace)::current_abi_cxx11_((string *)&tok_1.line_nr,local_18,tokens_03);
      bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tok_1.line_nr,")");
      std::__cxx11::string::~string((string *)&tok_1.line_nr);
      if (!bVar5) break;
      if ((__return_storage_ptr__->variable_arity & 1U) != 0) {
        local_110 = local_110 + 1;
      }
      anon_unknown_2::take
                ((token *)local_160,(vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18)
      ;
      if ((local_160._0_4_ != T_ID) &&
         (bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&tok_1,"."), uVar4 = tok_1.value.field_2._12_4_,
         uVar3 = tok_1.value.field_2._8_4_, bVar5)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"",&local_181);
        anon_unknown_2::throw_parse_error(uVar3,uVar4,invalid_argument,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator(&local_181);
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tok_1,".");
      uVar4 = tok_1.value.field_2._12_4_;
      uVar3 = tok_1.value.field_2._8_4_;
      if (bVar5) {
        if ((__return_storage_ptr__->variable_arity & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"",&local_1a9);
          anon_unknown_2::throw_parse_error(uVar3,uVar4,invalid_argument,&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::allocator<char>::~allocator(&local_1a9);
        }
        __return_storage_ptr__->variable_arity = true;
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->variables,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tok_1);
      }
      token::~token((token *)local_160);
      tokens_03 = extraout_RDX_00;
    }
    if (((__return_storage_ptr__->variable_arity & 1U) != 0) && (local_110 != 1)) {
      iVar1 = __return_storage_ptr__->line_nr;
      iVar2 = __return_storage_ptr__->column_nr;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"",(allocator<char> *)(b.filename.field_2._M_local_buf + 0xf))
      ;
      anon_unknown_2::throw_parse_error(iVar1,iVar2,invalid_argument,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)(b.filename.field_2._M_local_buf + 0xf));
    }
    anon_unknown_2::advance((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  }
  Begin::Begin((Begin *)local_230);
  make_begin((Begin *)((long)&beg.filename.field_2 + 8),
             (vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18,true);
  Begin::operator=((Begin *)local_230,(Begin *)((long)&beg.filename.field_2 + 8));
  Begin::~Begin((Begin *)((long)&beg.filename.field_2 + 8));
  while( true ) {
    sVar8 = std::
            vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
            ::size((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                    *)&b);
    local_461 = false;
    if (sVar8 == 1) {
      pvVar9 = std::
               vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
               ::front((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                        *)&b);
      local_461 = std::
                  holds_alternative<skiwi::Begin,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                            (pvVar9);
    }
    if (local_461 == false) break;
    pvVar9 = std::
             vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
             ::front((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                      *)&b);
    pBVar10 = std::
              get<skiwi::Begin,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                        (pvVar9);
    Begin::Begin((Begin *)local_2e0,pBVar10);
    Begin::operator=((Begin *)local_230,(Begin *)local_2e0);
    Begin::~Begin((Begin *)local_2e0);
  }
  std::
  variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
  ::variant<skiwi::Begin&,void,void,skiwi::Begin,void>
            ((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
              *)&local_3d0,(Begin *)local_230);
  std::
  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ::push_back(&__return_storage_ptr__->body,&local_3d0);
  std::
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  ::~variant(&local_3d0);
  name.field_2._M_local_buf[0xb] = '\x01';
  Begin::~Begin((Begin *)local_230);
  std::__cxx11::string::~string((string *)local_70);
  if ((name.field_2._M_local_buf[0xb] & 1U) == 0) {
    Lambda::~Lambda(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Lambda make_lambda(std::vector<token>& tokens)
  {
  if (tokens.empty())
    throw_parse_error(no_tokens);
  if (current_type(tokens) != token::T_ID)
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, bad_syntax);
  Lambda l;
  l.line_nr = tokens.back().line_nr;
  l.column_nr = tokens.back().column_nr;
  std::string name = current(tokens);
  l.variable_arity = false;
  if (name != "lambda")
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, expected_keyword, "lambda");
  advance(tokens);
  if (current(tokens) != "(") // rest argument
    {
    l.variable_arity = true;
    auto tok = take(tokens);
    l.variables.emplace_back(tok.value);
    }
  else
    {
    require(tokens, "(");
    int count_after_var = 0;
    while (current(tokens) != ")")
      {
      if (l.variable_arity)
        ++count_after_var;
      auto tok = take(tokens);
      if (tok.type != token::T_ID && tok.value != ".")
        throw_parse_error(tok.line_nr, tok.column_nr, invalid_argument);
      if (tok.value == ".")
        {
        if (l.variable_arity)
          throw_parse_error(tok.line_nr, tok.column_nr, invalid_argument);
        l.variable_arity = true;
        }
      else
        l.variables.emplace_back(tok.value);
      }
    if (l.variable_arity && (count_after_var != 1))
      throw_parse_error(l.line_nr, l.column_nr, invalid_argument);
    advance(tokens);
    }
  Begin b;
  b = make_begin(tokens, true);
  while (b.arguments.size() == 1 && std::holds_alternative<Begin>(b.arguments.front()))
    {
    Begin beg = std::get<Begin>(b.arguments.front());
    b = beg;
    }
  l.body.push_back(b);
  return l;
  }